

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void __thiscall CGameConsole::Toggle(CGameConsole *this,int Type)

{
  IInput *pIVar1;
  CUI *pCVar2;
  int in_ESI;
  CGameConsole *in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  float ReversedProgress;
  float Progress;
  float in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((in_RDI->m_ConsoleType == in_ESI) ||
     ((in_RDI->m_ConsoleState != 2 && (in_RDI->m_ConsoleState != 1)))) {
    in_RDI->m_ConsoleType = in_ESI;
    if ((in_RDI->m_ConsoleState == 0) || (in_RDI->m_ConsoleState == 2)) {
      fVar3 = TimeNow((CGameConsole *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
      in_RDI->m_StateChangeEnd = fVar3 + in_RDI->m_StateChangeDuration;
    }
    else {
      in_stack_ffffffffffffffdc = in_RDI->m_StateChangeEnd;
      fVar4 = TimeNow((CGameConsole *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
      fVar4 = in_stack_ffffffffffffffdc - fVar4;
      fVar3 = in_RDI->m_StateChangeDuration;
      fVar5 = TimeNow((CGameConsole *)CONCAT44(in_ESI,fVar4));
      in_RDI->m_StateChangeEnd = fVar5 + (fVar3 - fVar4);
    }
    if ((in_RDI->m_ConsoleState == 0) || (in_RDI->m_ConsoleState == 3)) {
      pIVar1 = CComponent::Input((CComponent *)0x157ee9);
      (*(pIVar1->super_IInterface)._vptr_IInterface[10])();
      pCVar2 = CComponent::UI((CComponent *)0x157efc);
      CUI::SetEnabled(pCVar2,false);
      CurrentConsole(in_RDI);
      CLineInput::Deactivate((CLineInput *)0x157f1f);
      in_RDI->m_ConsoleState = 1;
      (*(((in_RDI->super_CComponent).m_pClient)->m_pControls->super_CComponent)._vptr_CComponent[7])
                ();
    }
    else {
      pIVar1 = CComponent::Input((CComponent *)0x157f4b);
      (*(pIVar1->super_IInterface)._vptr_IInterface[9])();
      pCVar2 = CComponent::UI((CComponent *)0x157f5e);
      CUI::SetEnabled(pCVar2,true);
      CurrentConsole(in_RDI);
      CLineInput::Activate((CLineInput *)in_RDI,(EInputPriority)in_stack_ffffffffffffffdc);
      (*(((in_RDI->super_CComponent).m_pClient)->super_IGameClient).super_IInterface.
        _vptr_IInterface[0x17])();
      in_RDI->m_ConsoleState = 3;
    }
  }
  else {
    in_RDI->m_ConsoleType = in_ESI;
    CurrentConsole(in_RDI);
    CLineInput::Activate((CLineInput *)in_RDI,(EInputPriority)in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

void CGameConsole::Toggle(int Type)
{
	if(m_ConsoleType != Type && (m_ConsoleState == CONSOLE_OPEN || m_ConsoleState == CONSOLE_OPENING))
	{
		// don't toggle console, just switch what console to use
		m_ConsoleType = Type;
		CurrentConsole()->m_Input.Activate(CONSOLE);
	}
	else
	{
		m_ConsoleType = Type;
		if(m_ConsoleState == CONSOLE_CLOSED || m_ConsoleState == CONSOLE_OPEN)
		{
			m_StateChangeEnd = TimeNow()+m_StateChangeDuration;
		}
		else
		{
			float Progress = m_StateChangeEnd-TimeNow();
			float ReversedProgress = m_StateChangeDuration-Progress;

			m_StateChangeEnd = TimeNow()+ReversedProgress;
		}

		if(m_ConsoleState == CONSOLE_CLOSED || m_ConsoleState == CONSOLE_CLOSING)
		{
			Input()->MouseModeAbsolute();
			UI()->SetEnabled(false);
			CurrentConsole()->m_Input.Deactivate();
			m_ConsoleState = CONSOLE_OPENING;
			// reset controls
			m_pClient->m_pControls->OnReset();
		}
		else
		{
			Input()->MouseModeRelative();
			UI()->SetEnabled(true);
			CurrentConsole()->m_Input.Activate(CONSOLE);
			m_pClient->OnRelease();
			m_ConsoleState = CONSOLE_CLOSING;
		}
	}
}